

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O0

Uint64 __thiscall Diligent::CommandQueueVkImpl::WaitForIdle(CommandQueueVkImpl *this)

{
  Uint64 Value;
  atomic<unsigned_long> *paVar1;
  FenceVkImpl *pFVar2;
  __int_type_conflict3 FenceValue;
  lock_guard<std::mutex> QueueGuard;
  CommandQueueVkImpl *this_local;
  
  QueueGuard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&FenceValue,&this->m_QueueMutex)
  ;
  paVar1 = &this->m_NextFenceValue;
  LOCK();
  Value = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  (*vkQueueWaitIdle)(this->m_VkQueue);
  pFVar2 = RefCntAutoPtr<Diligent::FenceVkImpl>::operator->(&this->m_pFence);
  FenceVkImpl::Wait(pFVar2,0xffffffffffffffff);
  pFVar2 = RefCntAutoPtr<Diligent::FenceVkImpl>::operator->(&this->m_pFence);
  FenceVkImpl::Reset(pFVar2,Value);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&FenceValue);
  return Value;
}

Assistant:

Uint64 CommandQueueVkImpl::WaitForIdle()
{
    std::lock_guard<std::mutex> QueueGuard{m_QueueMutex};

    // Update last completed fence value to unlock all waiting events.
    const auto FenceValue = m_NextFenceValue.fetch_add(1);

    vkQueueWaitIdle(m_VkQueue);
    // For some reason after idling the queue not all fences are signaled
    m_pFence->Wait(UINT64_MAX);
    m_pFence->Reset(FenceValue);

    return FenceValue;
}